

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

void __thiscall CVmObjLookupTable::mark_undo_ref(CVmObjLookupTable *this,CVmUndoRecord *undo_rec)

{
  if (*(int *)((long)(undo_rec->id).ptrval + 8) == 5) {
    CVmObjTable::add_to_gc_queue
              (&G_obj_table_X,*(vm_obj_id_t *)((long)(undo_rec->id).ptrval + 0x10),2);
  }
  if ((undo_rec->oldval).typ == VM_OBJ) {
    CVmObjTable::add_to_gc_queue(&G_obj_table_X,(undo_rec->oldval).val.obj,2);
    return;
  }
  return;
}

Assistant:

void CVmObjLookupTable::
   mark_undo_ref(VMG_ struct CVmUndoRecord *undo_rec)
{
    lookuptab_undo_rec *rec;

    /* get our private record from the standard undo record */
    rec = (lookuptab_undo_rec *)undo_rec->id.ptrval;

    /* if the key in the record is an object, mark it referenced */
    if (rec->key.typ == VM_OBJ)
        G_obj_table->mark_all_refs(rec->key.val.obj, VMOBJ_REACHABLE);

    /* if the value in the record is an object, mark it as well */
    if (undo_rec->oldval.typ == VM_OBJ)
        G_obj_table->mark_all_refs(undo_rec->oldval.val.obj,
                                   VMOBJ_REACHABLE);
}